

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O1

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FuncflParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::FuncflParameters> *this,string *id,FuncflParameters *data)

{
  RealType RVar1;
  RealType RVar2;
  RealType RVar3;
  undefined4 uVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 uVar8;
  
  GenericData::GenericData(&this->super_GenericData,id);
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__SimpleTypeData_00246fc8;
  uVar4 = *(undefined4 *)&data->field_0x4;
  RVar1 = data->atomicMass;
  iVar5 = data->nrho;
  uVar6 = *(undefined4 *)&data->field_0x14;
  RVar2 = data->drho;
  iVar7 = data->nr;
  uVar8 = *(undefined4 *)&data->field_0x24;
  RVar3 = data->dr;
  (this->data_).atomicNumber = data->atomicNumber;
  *(undefined4 *)&(this->data_).field_0x4 = uVar4;
  (this->data_).atomicMass = RVar1;
  (this->data_).nrho = iVar5;
  *(undefined4 *)&(this->data_).field_0x14 = uVar6;
  (this->data_).drho = RVar2;
  (this->data_).nr = iVar7;
  *(undefined4 *)&(this->data_).field_0x24 = uVar8;
  (this->data_).dr = RVar3;
  (this->data_).rcut = data->rcut;
  std::vector<double,_std::allocator<double>_>::vector(&(this->data_).Z,&data->Z);
  std::vector<double,_std::allocator<double>_>::vector(&(this->data_).rho,&data->rho);
  std::vector<double,_std::allocator<double>_>::vector(&(this->data_).F,&data->F);
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}